

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

bool __thiscall
sentencepiece::SentencePieceProcessor::IsControl(SentencePieceProcessor *this,int id)

{
  ModelInterface *pMVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  Die local_29;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_28;
  
  (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
  util::Status::~Status((Status *)&local_28);
  if (local_28._M_head_impl == (Rep *)0x0) {
    pMVar1 = (this->model_)._M_t.
             super___uniq_ptr_impl<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::ModelInterface_*,_std::default_delete<sentencepiece::ModelInterface>_>
             .super__Head_base<0UL,_sentencepiece::ModelInterface_*,_false>._M_head_impl;
    iVar3 = (*pMVar1->_vptr_ModelInterface[0x13])(pMVar1,id);
    uVar2 = (undefined1)iVar3;
  }
  else {
    iVar3 = logging::GetMinLogLevel();
    if (iVar3 < 3) {
      local_29.die_ = false;
      pcVar4 = logging::BaseName("src/sentencepiece_processor.cc");
      poVar5 = std::operator<<((ostream *)&std::cerr,pcVar4);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3cf);
      poVar5 = std::operator<<(poVar5,") ");
      poVar5 = std::operator<<(poVar5,"LOG(");
      poVar5 = std::operator<<(poVar5,"ERROR");
      poVar5 = std::operator<<(poVar5,") ");
      (*this->_vptr_SentencePieceProcessor[7])(&local_28,this);
      pcVar4 = util::Status::error_message((Status *)&local_28);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5,"\nReturns default value ");
      std::ostream::operator<<(poVar5,0);
      util::Status::~Status((Status *)&local_28);
      error::Die::~Die(&local_29);
    }
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool SentencePieceProcessor::IsControl(int id) const {
  CHECK_STATUS_OR_RETURN_DEFAULT(0);
  return model_->IsControl(id);
}